

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PrimitiveSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::PrimitiveSymbol::PrimitiveKind&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          PrimitiveKind *args_3)

{
  PrimitiveKind PVar1;
  SourceLocation SVar2;
  size_t sVar3;
  char *pcVar4;
  PrimitiveSymbol *thisSym_;
  
  thisSym_ = (PrimitiveSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PrimitiveSymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (PrimitiveSymbol *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar3 = args_1->_M_len;
  pcVar4 = args_1->_M_str;
  SVar2 = *args_2;
  PVar1 = *args_3;
  (thisSym_->super_Symbol).kind = Primitive;
  (thisSym_->super_Symbol).name._M_len = sVar3;
  (thisSym_->super_Symbol).name._M_str = pcVar4;
  (thisSym_->super_Symbol).location = SVar2;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  *(undefined8 *)((long)&(thisSym_->table)._M_extent._M_extent_value + 2) = 0;
  *(undefined8 *)((long)&thisSym_->initVal + 2) = 0;
  (thisSym_->table)._M_ptr = (pointer)0x0;
  (thisSym_->table)._M_extent._M_extent_value = 0;
  (thisSym_->ports)._M_ptr = (pointer)0x0;
  (thisSym_->ports)._M_extent._M_extent_value = 0;
  thisSym_->primitiveKind = PVar1;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }